

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  pointer ppFVar1;
  FieldGeneratorBase *pFVar2;
  int i;
  ulong uVar3;
  long lVar4;
  int i_1;
  long lVar5;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> local_30;
  
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,"public void WriteTo(pb::CodedOutputStream output) {\n");
  io::Printer::Indent(printer);
  for (uVar3 = 0;
      ppFVar1 = (this->fields_by_number_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->fields_by_number_).
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3);
      uVar3 = uVar3 + 1) {
    local_30.ptr_ = CreateFieldGeneratorInternal(this,ppFVar1[uVar3]);
    pFVar2 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&local_30);
    (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[8])(pFVar2,printer);
    if (local_30.ptr_ != (FieldGeneratorBase *)0x0) {
      (*((local_30.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,"public int CalculateSize() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int size = 0;\n");
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(this->descriptor_ + 0x2c); lVar5 = lVar5 + 1) {
    local_30.ptr_ =
         CreateFieldGeneratorInternal
                   (this,(FieldDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar4));
    pFVar2 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&local_30);
    (*(pFVar2->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[9])(pFVar2,printer);
    if (local_30.ptr_ != (FieldGeneratorBase *)0x0) {
      (*((local_30.ptr_)->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])();
    }
    lVar4 = lVar4 + 0xa8;
  }
  io::Printer::Print(printer,"return size;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void MessageGenerator::GenerateMessageSerializationMethods(io::Printer* printer) {
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
      "public void WriteTo(pb::CodedOutputStream output) {\n");
  printer->Indent();

  // Serialize all the fields
  for (int i = 0; i < fields_by_number().size(); i++) {
    scoped_ptr<FieldGeneratorBase> generator(
      CreateFieldGeneratorInternal(fields_by_number()[i]));
    generator->GenerateSerializationCode(printer);
  }

  // TODO(jonskeet): Memoize size of frozen messages?
  printer->Outdent();
  printer->Print(
	"}\n"
	"\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    "public int CalculateSize() {\n");
  printer->Indent();
  printer->Print("int size = 0;\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    scoped_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
    generator->GenerateSerializedSizeCode(printer);
  }
  printer->Print("return size;\n");
  printer->Outdent();
  printer->Print("}\n\n");
}